

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t emit_back(flatcc_builder_t *B,flatcc_iov_state_t *iov)

{
  int iVar1;
  int iVar2;
  flatcc_builder_ref_t ref;
  flatcc_iov_state_t *iov_local;
  flatcc_builder_t *B_local;
  
  iVar1 = B->emit_end;
  B->emit_end = iVar1 + (int)iov->len;
  if (B->emit_end < iVar1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x2af,"flatcc_builder_ref_t emit_back(flatcc_builder_t *, flatcc_iov_state_t *)")
    ;
  }
  iVar2 = (*B->emit)(B->emit_context,iov->iov,iov->count,iVar1,iov->len);
  if (iVar2 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x2b3,"flatcc_builder_ref_t emit_back(flatcc_builder_t *, flatcc_iov_state_t *)")
    ;
  }
  return iVar1 + 1;
}

Assistant:

static inline flatcc_builder_ref_t emit_back(flatcc_builder_t *B, iov_state_t *iov)
{
    flatcc_builder_ref_t ref;

    ref = B->emit_end;
    B->emit_end = ref + (flatcc_builder_ref_t)iov->len;
    /*
     * Similar to emit_front check, but since we only emit vtables and
     * padding at the back, we are not concerned with iov->len overflow,
     * only total buffer overflow.
     *
     * With this check, vtable soffset references at table header can
     * still overflow in extreme cases, so this must be checked
     * separately.
     */
    if (B->emit_end < ref) {
        check(0, "buffer too large to represent");
        return 0;
    }
    if (B->emit(B->emit_context, iov->iov, iov->count, ref, iov->len)) {
        check(0, "emitter rejected buffer content");
        return 0;
    }
    /*
     * Back references always return ref + 1 because ref == 0 is valid and
     * should not be mistaken for error. vtables understand this.
     */
    return ref + 1;
}